

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstr.cpp
# Opt level: O1

void __thiscall NaCSTRFunc::Function(NaCSTRFunc *this,NaReal *x,NaReal *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  NaReal NVar17;
  NaReal NVar18;
  NaReal NVar19;
  double dVar20;
  long *plVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  if (y != (NaReal *)0x0 && x != (NaReal *)0x0) {
    plVar21 = (long *)(**(code **)(*(long *)this + 0x18))();
    dVar20 = (double)(**(code **)(*plVar21 + 8))(plVar21);
    plVar21 = (long *)(**(code **)(*(long *)this + 0x18))(this);
    uVar22 = (**(code **)(*plVar21 + 0x20))(plVar21);
    NVar17 = (this->cur).state[1];
    NVar18 = (this->cur).state[2];
    NVar19 = (this->cur).state[3];
    (this->prev).state[0] = (this->cur).state[0];
    (this->prev).state[1] = NVar17;
    (this->prev).state[4] = (this->cur).state[4];
    (this->prev).state[2] = NVar18;
    (this->prev).state[3] = NVar19;
    dVar1 = *x;
    dVar2 = this->k10;
    dVar11 = exp(-this->E1R / (this->prev).state[3]);
    dVar11 = dVar11 * dVar2;
    dVar2 = this->k20;
    dVar12 = exp(-this->E2R / (this->prev).state[3]);
    dVar12 = dVar12 * dVar2;
    dVar2 = this->V;
    dVar3 = this->drH_1;
    dVar4 = this->drH_2;
    dVar5 = this->q;
    dVar6 = (this->cur).state[1];
    dVar14 = (this->cur).state[2];
    dVar15 = (this->cur).state[3];
    dVar16 = (this->prev).state[0];
    auVar23._0_8_ = dVar5 * (this->c_Av - dVar16);
    auVar23._8_8_ = dVar5 * (this->c_Bv - (this->prev).state[1]);
    auVar24._8_8_ = dVar2;
    auVar24._0_8_ = dVar2;
    auVar24 = divpd(auVar23,auVar24);
    (this->cur).state[0] =
         (dVar16 * -(dVar11 + dVar12) + auVar24._0_8_) * dVar20 + (this->cur).state[0];
    (this->cur).state[1] = (dVar16 * dVar11 + auVar24._8_8_) * dVar20 + dVar6;
    dVar6 = this->T_v;
    dVar7 = (this->prev).state[3];
    dVar8 = (this->prev).state[4];
    dVar13 = this->A * this->k * (dVar7 - dVar8);
    dVar9 = this->rho;
    dVar10 = this->Cp;
    (this->cur).state[2] =
         (((this->c_Cv - (this->prev).state[2]) * dVar5) / dVar2 + dVar12 * dVar16) * dVar20 +
         dVar14;
    (this->cur).state[3] =
         ((dVar16 * dVar2 * (-dVar3 * dVar11 - dVar4 * dVar12) - dVar13) / (dVar2 * dVar9 * dVar10)
         + ((dVar6 - dVar7) * dVar5) / dVar2) * dVar20 + dVar15;
    (this->cur).state[4] =
         (dVar13 / (this->V_c * this->rho_c * this->Cp_c) +
         ((this->T_vc - dVar8) * dVar1) / this->V_c) * dVar20 + (this->cur).state[4];
    if (this->out != (NaDataFile *)0x0) {
      (**(code **)(*(long *)this->out + 0x30))();
      (**(code **)(*(long *)this->out + 0x10))(uVar22,this->out,0);
      (**(code **)(*(long *)this->out + 0x10))((int)*(undefined8 *)&this->cur,this->out,1);
      (**(code **)(*(long *)this->out + 0x10))
                ((int)*(undefined8 *)((long)&this->cur + 8),this->out,2);
      (**(code **)(*(long *)this->out + 0x10))
                ((int)*(undefined8 *)((long)&this->cur + 0x10),this->out,3);
      (**(code **)(*(long *)this->out + 0x10))
                ((int)*(undefined8 *)((long)&this->cur + 0x18),this->out,4);
      (**(code **)(*(long *)this->out + 0x10))
                ((int)*(undefined8 *)((long)&this->cur + 0x20),this->out,5);
      (**(code **)(*(long *)this->out + 0x10))(SUB84(dVar1,0),this->out,6);
    }
    *y = (this->cur).state[3];
  }
  return;
}

Assistant:

void
NaCSTRFunc::Function (NaReal* x, NaReal* y)
{
    if(NULL == x || NULL == y)
	return;

    NaReal dt = Timer().GetSamplingRate();	// seconds
    NaReal time = Timer().CurrentTime();	// seconds

    prev = cur;

    NaReal	q_c = *x;
    NaReal k1 = k10*exp(-E1R/prev.var.T);
    NaReal k2 = k20*exp(-E2R/prev.var.T);
    NaReal Q = prev.var.c_A*V*(k1*(-drH_1) + k2*(-drH_2));

    cur.var.c_A += dt*((c_Av - prev.var.c_A)*q/V - (k1+k2)*prev.var.c_A);
    cur.var.c_B += dt*((c_Bv - prev.var.c_B)*q/V + k1*prev.var.c_A);
    cur.var.c_C += dt*((c_Cv - prev.var.c_C)*q/V + k2*prev.var.c_A);
    cur.var.T += dt*((T_v - prev.var.T)*q/V
		     + (Q - A*k*(prev.var.T-prev.var.T_c))/(V*rho*Cp));
    cur.var.T_c += dt*((T_vc - prev.var.T_c)*q_c/V_c
		       + A*k*(prev.var.T-prev.var.T_c)/(V_c*rho_c*Cp_c));

    if(NULL != out) {
	out->AppendRecord();
	out->SetValue(time, 0);
	out->SetValue(cur.var.c_A, 1);
	out->SetValue(cur.var.c_B, 2);
	out->SetValue(cur.var.c_C, 3);
	out->SetValue(cur.var.T, 4);
	out->SetValue(cur.var.T_c, 5);
	out->SetValue(q_c, 6);
    }

    *y = cur.var.T;
}